

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int gost_cms_set_ktri_shared_info(EVP_PKEY_CTX *pctx,CMS_RecipientInfo *ri)

{
  int function;
  void *pvVar1;
  CMS_RecipientInfo *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  gost_pmeth_data *gctx;
  X509_ALGOR *alg;
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  X509_ALGOR *local_20;
  CMS_RecipientInfo *local_18;
  
  local_18 = in_RSI;
  pvVar1 = EVP_PKEY_CTX_get_data(in_RDI);
  CMS_RecipientInfo_ktri_get0_algs(local_18,(EVP_PKEY **)0x0,(X509 **)0x0,&local_20);
  function = OBJ_obj2nid(local_20->algorithm);
  if (((function == 0x32b) || (function == 0x331)) || (function - 0x3d3U < 2)) {
    *(undefined4 *)((long)pvVar1 + 0x3c) = 0x32d;
  }
  else if (function == 0x49d) {
    *(undefined4 *)((long)pvVar1 + 0x3c) = 0x4a4;
  }
  else {
    if (function != 0x49f) {
      ERR_GOST_error(function,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
      return 0;
    }
    *(undefined4 *)((long)pvVar1 + 0x3c) = 0x3f5;
  }
  return 1;
}

Assistant:

static int gost_cms_set_ktri_shared_info(EVP_PKEY_CTX *pctx, CMS_RecipientInfo *ri)
{
	X509_ALGOR *alg;
	struct gost_pmeth_data *gctx = EVP_PKEY_CTX_get_data(pctx);

	CMS_RecipientInfo_ktri_get0_algs(ri, NULL, NULL, &alg);

	switch (OBJ_obj2nid(alg->algorithm)) {
		case NID_kuznyechik_kexp15:
			gctx->cipher_nid = NID_kuznyechik_ctr;
			break;

		case NID_magma_kexp15:
			gctx->cipher_nid = NID_magma_ctr;
			break;

		case NID_id_GostR3410_2001:
		case NID_id_GostR3410_2001DH:
		case NID_id_GostR3410_2012_256:
		case NID_id_GostR3410_2012_512:
			gctx->cipher_nid = NID_id_Gost28147_89;
			break;

		default:
			GOSTerr(GOST_F_GOST_CMS_SET_KTRI_SHARED_INFO, GOST_R_UNSUPPORTED_RECIPIENT_INFO);
			return 0;
	}

	return 1;
}